

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::QueueDimensionSpecifierSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,QueueDimensionSpecifierSyntax *this,
          size_t index)

{
  Token token;
  size_t index_local;
  QueueDimensionSpecifierSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->dollar).kind;
    token._2_1_ = (this->dollar).field_0x2;
    token.numFlags.raw = (this->dollar).numFlags.raw;
    token.rawLen = (this->dollar).rawLen;
    token.info = (this->dollar).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->maxSizeClause->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax QueueDimensionSpecifierSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return dollar;
        case 1: return maxSizeClause;
        default: return nullptr;
    }
}